

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

int lws_cache_heap_get(lws_cache_ttl_lru *_c,char *specific_key,void **pdata,size_t *psize)

{
  lws_cache_ops *d;
  int iVar1;
  lws_cache_ops **pplVar2;
  
  pplVar2 = &_c[1].info.ops;
  while( true ) {
    d = *pplVar2;
    if (d == (lws_cache_ops *)0x0) {
      return 1;
    }
    iVar1 = strcmp(specific_key,(char *)((long)&d->invalidate + (long)d->lookup));
    if (iVar1 == 0) break;
    pplVar2 = (lws_cache_ops **)&d->destroy;
  }
  lws_dll2_remove((lws_dll2 *)d);
  lws_dll2_add_head((lws_dll2 *)d,(lws_dll2_owner *)&_c[1].info.parent);
  if (pdata == (void **)0x0) {
    return 0;
  }
  *pdata = &d->invalidate;
  *psize = (size_t)d->lookup;
  return 0;
}

Assistant:

static int
lws_cache_heap_get(struct lws_cache_ttl_lru *_c, const char *specific_key,
		   const void **pdata, size_t *psize)
{
	lws_cache_ttl_lru_t_heap_t *cache = (lws_cache_ttl_lru_t_heap_t *)_c;
	lws_cache_ttl_item_heap_t *item;

	item = lws_cache_heap_specific(cache, specific_key);
	if (!item)
		return 1;

	/* we are using it, move it to lru head */
	lws_dll2_remove(&item->list_lru);
	lws_dll2_add_head(&item->list_lru, &cache->items_lru);

	if (pdata) {
		*pdata = (const void *)&item[1];
		*psize = item->size;
	}

	return 0;
}